

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O1

void av1_compute_gm_for_valid_ref_frames
               (AV1_COMP *cpi,aom_internal_error_info *error_info,YV12_BUFFER_CONFIG **ref_buf,
               int frame,MotionModel *motion_models,uint8_t *segment_map,int segment_map_w,
               int segment_map_h)

{
  RefCntBuffer *pRVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  uint8_t *segment_map_00;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int64_t ref_frame_error;
  int64_t iVar7;
  uint16_t n;
  sbyte sVar8;
  long lVar9;
  WarpedMotionParams *pWVar10;
  _Bool mem_alloc_failed;
  uint8_t *local_90;
  double local_88;
  WarpedMotionParams local_7c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pRVar1 = (cpi->common).prev_frame;
  lVar9 = (long)frame;
  local_40 = lVar9 * 0x24;
  pWVar10 = &default_warp_params;
  if (pRVar1 != (RefCntBuffer *)0x0) {
    pWVar10 = pRVar1->global_motion + lVar9;
  }
  pYVar2 = cpi->source;
  local_48 = (ulong)(uint)(pYVar2->field_2).field_0.y_crop_width;
  local_50 = (ulong)(uint)(pYVar2->field_3).field_0.y_crop_height;
  local_58 = (ulong)(uint)(pYVar2->field_4).field_0.y_stride;
  local_88 = erroradv_tr[(cpi->sf).gm_sf.gm_erroradv_tr_level];
  local_38 = (ulong)(uint)(cpi->sf).gm_sf.num_refinement_steps;
  mem_alloc_failed = false;
  local_90 = segment_map;
  _Var3 = aom_compute_global_motion
                    ('\x02',pYVar2,ref_buf[lVar9],((cpi->common).seq_params)->bit_depth,
                     GLOBAL_MOTION_METHOD_DISFLOW,(cpi->sf).gm_sf.downsample_level,motion_models,1,
                     &mem_alloc_failed);
  if (!_Var3) {
    if (mem_alloc_failed != true) {
      return;
    }
    aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate global motion buffers");
    return;
  }
  if (motion_models->num_inliers == 0) {
    return;
  }
  av1_convert_model_to_params(motion_models->params,&local_7c);
  iVar4 = av1_get_shear_params(&local_7c);
  segment_map_00 = local_90;
  if (iVar4 == 0) {
    return;
  }
  if (local_7c.wmtype < 2) {
    return;
  }
  av1_compute_feature_segmentation_map
            (local_90,segment_map_w,segment_map_h,motion_models->inliers,motion_models->num_inliers)
  ;
  ref_frame_error =
       av1_segmented_frame_error
                 ((uint)((cpi->td).mb.e_mbd.cur_buf)->flags >> 3 & 1,(cpi->td).mb.e_mbd.bd,
                  (ref_buf[lVar9]->field_5).field_0.y_buffer,
                  (ref_buf[lVar9]->field_4).field_0.y_stride,(cpi->source->field_5).field_0.y_buffer
                  ,(int)local_58,(int)local_48,(int)local_50,segment_map_00,segment_map_w);
  if (ref_frame_error == 0) {
    return;
  }
  pYVar2 = ref_buf[lVar9];
  iVar7 = av1_refine_integerized_param
                    (&local_7c,local_7c.wmtype,(uint)((cpi->td).mb.e_mbd.cur_buf)->flags >> 3 & 1,
                     (cpi->td).mb.e_mbd.bd,(pYVar2->field_5).field_0.y_buffer,
                     (pYVar2->field_2).field_0.y_crop_width,(pYVar2->field_3).field_0.y_crop_height,
                     (pYVar2->field_4).field_0.y_stride,(cpi->source->field_5).field_0.y_buffer,
                     (int)local_48,(int)local_50,(int)local_58,(int)local_38,ref_frame_error,
                     local_90,segment_map_w,local_88);
  if ((local_7c._32_4_ & 0xff) < 2) {
    return;
  }
  local_90 = (uint8_t *)((double)iVar7 / (double)ref_frame_error);
  _Var3 = (cpi->common).features.allow_high_precision_mv;
  if ((local_7c._32_4_ & 0xff) - 2 < 2) {
    iVar5 = aom_count_signed_primitive_refsubexpfin
                      (0x1001,3,(ushort)((uint)pWVar10->wmmat[2] >> 1) ^ 0x8000,
                       (ushort)((uint)local_7c.wmmat[2] >> 1) ^ 0x8000);
    iVar4 = aom_count_signed_primitive_refsubexpfin
                      (0x1001,3,(int16_t)((uint)pWVar10->wmmat[3] >> 1),
                       (int16_t)((uint)local_7c.wmmat[3] >> 1));
    iVar4 = iVar4 + iVar5;
    if (2 < local_7c.wmtype) {
      iVar5 = aom_count_signed_primitive_refsubexpfin
                        (0x1001,3,(int16_t)((uint)pWVar10->wmmat[4] >> 1),
                         (int16_t)((uint)local_7c.wmmat[4] >> 1));
      iVar6 = aom_count_signed_primitive_refsubexpfin
                        (0x1001,3,(ushort)((uint)pWVar10->wmmat[5] >> 1) ^ 0x8000,
                         (ushort)((uint)local_7c.wmmat[5] >> 1) ^ 0x8000);
      iVar4 = iVar4 + iVar6 + iVar5;
    }
  }
  else {
    iVar5 = 0;
    iVar4 = 0;
    if ((local_7c._32_4_ & 0xff) != 1) goto LAB_001d74ce;
  }
  n = 0x1001;
  if (local_7c.wmtype == '\x01') {
    n = (ushort)_Var3 * 0x100 + 0x101;
  }
  sVar8 = 10;
  if (local_7c.wmtype == '\x01') {
    sVar8 = (_Var3 == false) + 0xd;
  }
  iVar5 = aom_count_signed_primitive_refsubexpfin
                    (n,3,(int16_t)(pWVar10->wmmat[0] >> sVar8),(int16_t)(local_7c.wmmat[0] >> sVar8)
                    );
  iVar6 = aom_count_signed_primitive_refsubexpfin
                    (n,3,(int16_t)(pWVar10->wmmat[1] >> sVar8),(int16_t)(local_7c.wmmat[1] >> sVar8)
                    );
  iVar5 = (iVar6 + iVar5 + iVar4) * 0x200;
LAB_001d74ce:
  iVar4 = av1_is_enough_erroradvantage((double)local_90,iVar5,local_88);
  if ((iVar4 != 0) && ((double)local_90 < local_88)) {
    *(undefined4 *)((long)(cpi->common).global_motion[0].wmmat + local_40 + 0x20) = local_7c._32_4_;
    *(ulong *)((long)(cpi->common).global_motion[0].wmmat + local_40 + 0x10) =
         CONCAT44(local_7c.wmmat[5],local_7c.wmmat[4]);
    *(undefined8 *)((long)(cpi->common).global_motion[0].wmmat + local_40 + 0x18) = local_7c._24_8_;
    *(ulong *)((long)(cpi->common).global_motion[0].wmmat + local_40) =
         CONCAT44(local_7c.wmmat[1],local_7c.wmmat[0]);
    *(ulong *)((long)(cpi->common).global_motion[0].wmmat + local_40 + 8) =
         CONCAT44(local_7c.wmmat[3],local_7c.wmmat[2]);
  }
  return;
}

Assistant:

void av1_compute_gm_for_valid_ref_frames(
    AV1_COMP *cpi, struct aom_internal_error_info *error_info,
    YV12_BUFFER_CONFIG *ref_buf[REF_FRAMES], int frame,
    MotionModel *motion_models, uint8_t *segment_map, int segment_map_w,
    int segment_map_h) {
  AV1_COMMON *const cm = &cpi->common;
  const WarpedMotionParams *ref_params =
      cm->prev_frame ? &cm->prev_frame->global_motion[frame]
                     : &default_warp_params;

  compute_global_motion_for_ref_frame(cpi, error_info, ref_buf, frame,
                                      motion_models, segment_map, segment_map_w,
                                      segment_map_h, ref_params);
}